

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

void __thiscall cppcms::service::service(service *this,value *v)

{
  service *psVar1;
  noncopyable *in_RDI;
  service *in_stack_00000040;
  service *in_stack_00000140;
  pointer in_stack_ffffffffffffffa8;
  unique_ptr<cppcms::json::value,_std::default_delete<cppcms::json::value>_> *this_00;
  
  booster::noncopyable::noncopyable(in_RDI);
  psVar1 = (service *)operator_new(200);
  cppcms::impl::service::service(in_stack_00000040);
  booster::hold_ptr<cppcms::impl::service>::hold_ptr
            ((hold_ptr<cppcms::impl::service> *)in_RDI,psVar1);
  psVar1 = booster::hold_ptr<cppcms::impl::service>::operator->
                     ((hold_ptr<cppcms::impl::service> *)in_RDI);
  this_00 = &psVar1->settings_;
  operator_new(8);
  json::value::value((value *)this_00,in_stack_ffffffffffffffa8);
  std::unique_ptr<cppcms::json::value,_std::default_delete<cppcms::json::value>_>::reset
            (this_00,in_stack_ffffffffffffffa8);
  setup(in_stack_00000140);
  return;
}

Assistant:

service::service(json::value const &v) :
	impl_(new impl::service())
{
	impl_->settings_.reset(new json::value(v));
	setup();
}